

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

DdNode * Abc_ConvertSopToBdd(DdManager *dd,char *pSop,DdNode **pbVars)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar2 = Abc_SopGetVarNum(pSop);
  pDVar4 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar4);
  iVar3 = Abc_SopIsExorType(pSop);
  if (iVar3 != 0) {
    uVar8 = 0;
    uVar10 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar10 = uVar8;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      if (pbVars == (DdNode **)0x0) {
        pDVar5 = Cudd_bddIthVar(dd,(int)uVar8);
      }
      else {
        pDVar5 = pbVars[uVar8];
      }
      pDVar5 = Cudd_bddXor(dd,pDVar4,pDVar5);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar4 = pDVar5;
    }
LAB_006a1bad:
    iVar3 = Abc_SopGetPhase(pSop);
    pDVar4 = (DdNode *)((ulong)(iVar3 == 0) ^ (ulong)pDVar4);
    Cudd_Deref(pDVar4);
    return pDVar4;
  }
  pcVar7 = pSop;
LAB_006a1ad4:
  if (*pcVar7 != '\0') {
    pDVar5 = Cudd_ReadOne(dd);
    Cudd_Ref(pDVar5);
    lVar9 = 0;
    do {
      cVar1 = pcVar7[lVar9];
      if (cVar1 == '0') {
        if (pbVars == (DdNode **)0x0) {
          pDVar6 = Cudd_bddIthVar(dd,(int)lVar9);
        }
        else {
          pDVar6 = pbVars[lVar9];
        }
        pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
LAB_006a1b46:
        pDVar6 = Cudd_bddAnd(dd,pDVar5,pDVar6);
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(dd,pDVar5);
      }
      else {
        if (cVar1 == '1') {
          if (pbVars == (DdNode **)0x0) {
            pDVar6 = Cudd_bddIthVar(dd,(int)lVar9);
          }
          else {
            pDVar6 = pbVars[lVar9];
          }
          goto LAB_006a1b46;
        }
        if ((cVar1 == '\0') || (pDVar6 = pDVar5, cVar1 == ' ')) goto LAB_006a1b6f;
      }
      lVar9 = lVar9 + 1;
      pDVar5 = pDVar6;
    } while( true );
  }
  goto LAB_006a1bad;
LAB_006a1b6f:
  pDVar6 = Cudd_bddOr(dd,pDVar4,pDVar5);
  Cudd_Ref(pDVar6);
  Cudd_RecursiveDeref(dd,pDVar4);
  Cudd_RecursiveDeref(dd,pDVar5);
  pcVar7 = pcVar7 + (int)(uVar2 + 3);
  pDVar4 = pDVar6;
  goto LAB_006a1ad4;
}

Assistant:

DdNode * Abc_ConvertSopToBdd( DdManager * dd, char * pSop, DdNode ** pbVars )
{
    DdNode * bSum, * bCube, * bTemp, * bVar;
    char * pCube;
    int nVars, Value, v;

    // start the cover
    nVars = Abc_SopGetVarNum(pSop);
    bSum = Cudd_ReadLogicZero(dd);   Cudd_Ref( bSum );
    if ( Abc_SopIsExorType(pSop) )
    {
        for ( v = 0; v < nVars; v++ )
        {
            bSum  = Cudd_bddXor( dd, bTemp = bSum, pbVars? pbVars[v] : Cudd_bddIthVar(dd, v) );   Cudd_Ref( bSum );
            Cudd_RecursiveDeref( dd, bTemp );
        }
    }
    else
    {
        // check the logic function of the node
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            bCube = Cudd_ReadOne(dd);   Cudd_Ref( bCube );
            Abc_CubeForEachVar( pCube, Value, v )
            {
                if ( Value == '0' )
                    bVar = Cudd_Not( pbVars? pbVars[v] : Cudd_bddIthVar( dd, v ) );
                else if ( Value == '1' )
                    bVar = pbVars? pbVars[v] : Cudd_bddIthVar( dd, v );
                else
                    continue;
                bCube  = Cudd_bddAnd( dd, bTemp = bCube, bVar );   Cudd_Ref( bCube );
                Cudd_RecursiveDeref( dd, bTemp );
            }
            bSum = Cudd_bddOr( dd, bTemp = bSum, bCube );   
            Cudd_Ref( bSum );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
        }
    }
    // complement the result if necessary
    bSum = Cudd_NotCond( bSum, !Abc_SopGetPhase(pSop) );
    Cudd_Deref( bSum );
    return bSum;
}